

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_3_comma_operator_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = G->val[-2];
  if (pPVar1->type == PVIP_NODE_LIST) {
    G->ss = pPVar1;
  }
  else {
    pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_LIST,pPVar1);
    G->ss = pPVar1;
    G->val[-2] = pPVar1;
  }
  return;
}

Assistant:

YY_ACTION(void) yy_3_comma_operator_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define a G->val[-2]
  yyprintf((stderr, "do yy_3_comma_operator_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        if (a->type==PVIP_NODE_LIST) {\n\
            yy=a;\n\
        } else {\n\
            yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_LIST, a);\n\
            a=yy;\n\
        }\n\
    }\n"));
  
        if (a->type==PVIP_NODE_LIST) {
            yy=a;
        } else {
            yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_LIST, a);
            a=yy;
        }
    ;
#undef b
#undef a
}